

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O2

SUNErrCode SUNAdaptController_Space_Soderlind(SUNAdaptController C,long *lenrw,long *leniw)

{
  *lenrw = 10;
  *leniw = 2;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Space_Soderlind(SUNAdaptController C,
                                              long int* lenrw, long int* leniw)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = 10;
  *leniw = 2;
  return SUN_SUCCESS;
}